

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.hpp
# Opt level: O1

ProgramSources * __thiscall
vk::ProgramCollection<glu::ProgramSources>::add
          (ProgramCollection<glu::ProgramSources> *this,string *name)

{
  mapped_type pPVar1;
  mapped_type *ppPVar2;
  MovePtr<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_> prog;
  UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_> local_28;
  
  pPVar1 = (mapped_type)operator_new(0xd0);
  (pPVar1->transformFeedbackVaryings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar1->transformFeedbackVaryings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(pPVar1->transformFeedbackVaryings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(pPVar1->transformFeedbackVaryings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  memset(pPVar1,0,0xac);
  local_28.m_data.ptr = pPVar1;
  ppPVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
            ::operator[](&this->m_programs,name);
  *ppPVar2 = pPVar1;
  local_28.m_data.ptr = (ProgramSources *)0x0;
  ppPVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
            ::operator[](&this->m_programs,name);
  pPVar1 = *ppPVar2;
  de::details::UniqueBase<glu::ProgramSources,_de::DefaultDeleter<glu::ProgramSources>_>::reset
            (&local_28);
  return pPVar1;
}

Assistant:

Program& ProgramCollection<Program>::add (const std::string& name)
{
	DE_ASSERT(!contains(name));
	de::MovePtr<Program> prog = de::newMovePtr<Program>();
	m_programs[name] = prog.get();
	prog.release();
	return *m_programs[name];
}